

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseGetLasts(xmlParserCtxtPtr ctxt,xmlChar **lastlt,xmlChar **lastgt)

{
  xmlChar xVar1;
  xmlGenericErrorFunc UNRECOVERED_JUMPTABLE;
  xmlChar *pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  
  if (lastlt == (xmlChar **)0x0 || lastgt == (xmlChar **)0x0) {
    pp_Var3 = __xmlGenericError();
    UNRECOVERED_JUMPTABLE = *pp_Var3;
    ppvVar4 = __xmlGenericErrorContext();
    (*UNRECOVERED_JUMPTABLE)(*ppvVar4,"Internal error: xmlParseGetLasts\n");
    return;
  }
  if ((ctxt->progressive == 0) || (ctxt->inputNr != 1)) {
LAB_0016e269:
    *lastlt = (xmlChar *)0x0;
    *lastgt = (xmlChar *)0x0;
  }
  else {
    pxVar2 = ctxt->input->end + -1;
    do {
      pxVar5 = pxVar2;
      if (pxVar5 < ctxt->input->base) goto LAB_0016e269;
      pxVar2 = pxVar5 + -1;
    } while (*pxVar5 != '<');
    *lastlt = pxVar5;
    pxVar2 = ctxt->input->end;
    pxVar6 = pxVar5 + 1;
LAB_0016e210:
    if (pxVar6 < pxVar2) {
      xVar1 = *pxVar6;
      if (xVar1 == '\"') {
        do {
          pxVar7 = pxVar6 + 1;
          if (pxVar2 <= pxVar7) break;
          pxVar6 = pxVar7;
        } while (*pxVar7 != '\"');
      }
      else {
        if (xVar1 != '\'') {
          if (xVar1 == '>') {
            *lastgt = pxVar6;
            return;
          }
          pxVar6 = pxVar6 + 1;
          goto LAB_0016e210;
        }
        do {
          pxVar7 = pxVar6 + 1;
          if (pxVar2 <= pxVar7) break;
          pxVar6 = pxVar7;
        } while (*pxVar7 != '\'');
      }
      pxVar6 = pxVar7 + 1;
      if (pxVar2 <= pxVar7) {
        pxVar6 = pxVar7;
      }
      goto LAB_0016e210;
    }
    pxVar2 = pxVar5 + -1;
    do {
      pxVar5 = pxVar2;
      if (pxVar5 < ctxt->input->base) {
        *lastgt = (xmlChar *)0x0;
        return;
      }
      pxVar2 = pxVar5 + -1;
    } while (*pxVar5 != '>');
    *lastgt = pxVar5;
  }
  return;
}

Assistant:

static void
xmlParseGetLasts(xmlParserCtxtPtr ctxt, const xmlChar **lastlt,
                 const xmlChar **lastgt) {
    const xmlChar *tmp;

    if ((ctxt == NULL) || (lastlt == NULL) || (lastgt == NULL)) {
	xmlGenericError(xmlGenericErrorContext,
		    "Internal error: xmlParseGetLasts\n");
	return;
    }
    if ((ctxt->progressive != 0) && (ctxt->inputNr == 1)) {
        tmp = ctxt->input->end;
	tmp--;
	while ((tmp >= ctxt->input->base) && (*tmp != '<')) tmp--;
	if (tmp < ctxt->input->base) {
	    *lastlt = NULL;
	    *lastgt = NULL;
	} else {
	    *lastlt = tmp;
	    tmp++;
	    while ((tmp < ctxt->input->end) && (*tmp != '>')) {
	        if (*tmp == '\'') {
		    tmp++;
		    while ((tmp < ctxt->input->end) && (*tmp != '\'')) tmp++;
		    if (tmp < ctxt->input->end) tmp++;
		} else if (*tmp == '"') {
		    tmp++;
		    while ((tmp < ctxt->input->end) && (*tmp != '"')) tmp++;
		    if (tmp < ctxt->input->end) tmp++;
		} else
		    tmp++;
	    }
	    if (tmp < ctxt->input->end)
	        *lastgt = tmp;
	    else {
	        tmp = *lastlt;
		tmp--;
		while ((tmp >= ctxt->input->base) && (*tmp != '>')) tmp--;
		if (tmp >= ctxt->input->base)
		    *lastgt = tmp;
		else
		    *lastgt = NULL;
	    }
	}
    } else {
        *lastlt = NULL;
	*lastgt = NULL;
    }
}